

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.h
# Opt level: O2

void __thiscall TPZInt1Point::Point(TPZInt1Point *this,int ip,TPZVec<double> *pos,REAL *w)

{
  ostream *poVar1;
  
  if (ip != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"TPZInt1Point:: Bad number point ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,ip);
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  *w = 1.0;
  return;
}

Assistant:

inline void TPZInt1Point::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
#ifndef PZNODEBUG
	if(ip!=0) {
		std::cout << "TPZInt1Point:: Bad number point " << ip << std::endl;
		return;
	}
#endif
	w = 1.;
}